

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

value * __thiscall
mjs::interpreter::impl::operator()(value *__return_storage_ptr__,impl *this,function_expression *e)

{
  gc_heap *local_20;
  uint32_t local_18;
  
  create_function((impl *)&stack0xffffffffffffffe0,(function_base *)this,
                  (scope_ptr *)&e->super_function_base);
  __return_storage_ptr__->type_ = object;
  (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
  heap_ = local_20;
  *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_18;
  if (local_20 != (gc_heap *)0x0) {
    gc_heap::attach(local_20,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffe0);
  return __return_storage_ptr__;
}

Assistant:

value operator()(const function_expression& e) {
        // string{heap_, s.id()}
        return value{create_function(e, active_scope_)};
    }